

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbytearray.cpp
# Opt level: O0

QByteArray * toCase_template<QByteArray_const>(QByteArray *input,_func_uchar_uchar *lookup)

{
  char cVar1;
  char cVar2;
  const_iterator pcVar3;
  const_iterator pcVar4;
  iterator pcVar5;
  qsizetype qVar6;
  code *in_RDX;
  QByteArray *in_RDI;
  char *p;
  char *b;
  uchar converted;
  uchar ch;
  char *e;
  char *firstBad;
  char *orig_begin;
  QByteArray *s;
  QByteArray *in_stack_ffffffffffffff78;
  undefined7 in_stack_ffffffffffffff80;
  undefined1 in_stack_ffffffffffffff87;
  iterator local_58;
  char *local_28;
  
  pcVar3 = QByteArray::constBegin((QByteArray *)0x4b6ea0);
  pcVar4 = QByteArray::constEnd((QByteArray *)0x4b6eb9);
  for (local_28 = pcVar3;
      (local_28 != pcVar4 && (cVar2 = *local_28, cVar1 = (*in_RDX)(cVar2), cVar2 == cVar1));
      local_28 = local_28 + 1) {
  }
  if (local_28 == pcVar4) {
    QByteArray::QByteArray
              ((QByteArray *)CONCAT17(in_stack_ffffffffffffff87,in_stack_ffffffffffffff80),
               in_stack_ffffffffffffff78);
  }
  else {
    (in_RDI->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    (in_RDI->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    (in_RDI->d).ptr = &DAT_aaaaaaaaaaaaaaaa;
    QByteArray::QByteArray
              ((QByteArray *)CONCAT17(in_stack_ffffffffffffff87,in_stack_ffffffffffffff80),
               in_stack_ffffffffffffff78);
    pcVar5 = QByteArray::begin((QByteArray *)0x4b6f5d);
    qVar6 = QByteArray::size(in_RDI);
    for (local_58 = pcVar5 + ((long)local_28 - (long)pcVar3); local_58 != pcVar5 + qVar6;
        local_58 = local_58 + 1) {
      cVar2 = (*in_RDX)(*local_58);
      *local_58 = cVar2;
    }
  }
  return in_RDI;
}

Assistant:

static QByteArray toCase_template(T &input, uchar (*lookup)(uchar))
{
    // find the first bad character in input
    const char *orig_begin = input.constBegin();
    const char *firstBad = orig_begin;
    const char *e = input.constEnd();
    for ( ; firstBad != e ; ++firstBad) {
        uchar ch = uchar(*firstBad);
        uchar converted = lookup(ch);
        if (ch != converted)
            break;
    }

    if (firstBad == e)
        return std::move(input);

    // transform the rest
    QByteArray s = std::move(input);    // will copy if T is const QByteArray
    char *b = s.begin();            // will detach if necessary
    char *p = b + (firstBad - orig_begin);
    e = b + s.size();
    for ( ; p != e; ++p)
        *p = char(lookup(uchar(*p)));
    return s;
}